

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_linux_epoll.c
# Opt level: O2

void test_notify_hup_event(void)

{
  cio_error cVar1;
  _func_int_int_int_int_epoll_event_ptr *epoll_ctrl_fakes [2];
  cio_event_notifier ev;
  cio_eventloop loop;
  
  epoll_ctl_fake.custom_fake_seq = epoll_ctrl_fakes;
  epoll_wait_fake.custom_fake = notify_write_and_hup;
  epoll_ctrl_fakes[0] = epoll_ctl_nosave;
  epoll_ctrl_fakes[1] = epoll_ctl_save;
  epoll_ctl_fake.custom_fake_seq_len = 2;
  memset(&loop,0,0x4e8);
  cVar1 = cio_eventloop_init(&loop);
  UnityAssertEqualNumber(0,(long)cVar1,(char *)0x0,0x229,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (1,(ulong)epoll_create1_fake.call_count,(char *)0x0,0x22a,UNITY_DISPLAY_STYLE_INT);
  ev.fd = 0x2a;
  ev.write_callback = epoll_callback;
  ev.context = &loop;
  cVar1 = cio_linux_eventloop_add(&loop,&ev);
  UnityAssertEqualNumber(0,(long)cVar1,(char *)0x0,0x232,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (3,(ulong)epoll_ctl_fake.call_count,(char *)0x0,0x233,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            ((long)loop.epoll_fd,(long)epoll_ctl_fake.arg0_val,(char *)0x0,0x234,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber(1,(long)epoll_ctl_fake.arg1_val,(char *)0x0,0x235,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (0x2a,(long)epoll_ctl_fake.arg2_val,(char *)0x0,0x236,UNITY_DISPLAY_STYLE_INT);
  cVar1 = cio_linux_eventloop_register_write(&loop,&ev);
  UnityAssertEqualNumber(0,(long)cVar1,(char *)0x0,0x239,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (4,(ulong)epoll_ctl_fake.call_count,(char *)0x0,0x23a,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            ((long)loop.epoll_fd,(long)epoll_ctl_fake.arg0_val,(char *)0x0,0x23b,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber(3,(long)epoll_ctl_fake.arg1_val,(char *)0x0,0x23c,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (0x2a,(long)epoll_ctl_fake.arg2_val,(char *)0x0,0x23d,UNITY_DISPLAY_STYLE_INT);
  cio_eventloop_run(&loop);
  UnityAssertEqualNumber
            (1,(ulong)epoll_callback_fake.call_count,(char *)0x0,0x240,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            ((UNITY_INT)&loop,(UNITY_INT)epoll_callback_fake.arg0_val,(char *)0x0,0x241,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (-1,(long)epoll_callback_fake.arg1_val,"callback was not called with error code!",0x242,
             UNITY_DISPLAY_STYLE_INT);
  cio_eventloop_destroy(&loop);
  UnityAssertEqualNumber(2,(ulong)close_fake.call_count,(char *)0x0,0x245,UNITY_DISPLAY_STYLE_INT);
  return;
}

Assistant:

static void test_notify_hup_event(void)
{
	epoll_wait_fake.custom_fake = notify_write_and_hup;
	int (*epoll_ctrl_fakes[])(int, int, int, struct epoll_event *) = {epoll_ctl_nosave, epoll_ctl_save};
	SET_CUSTOM_FAKE_SEQ(epoll_ctl, epoll_ctrl_fakes, ARRAY_SIZE(epoll_ctrl_fakes))

	struct cio_eventloop loop = {0};
	enum cio_error err = cio_eventloop_init(&loop);
	TEST_ASSERT_EQUAL(CIO_SUCCESS, err);
	TEST_ASSERT_EQUAL(1, epoll_create1_fake.call_count);

	static const int fake_fd = 42;
	struct cio_event_notifier ev;
	ev.fd = fake_fd;
	ev.write_callback = epoll_callback;
	ev.context = &loop;
	err = cio_linux_eventloop_add(&loop, &ev);
	TEST_ASSERT_EQUAL(CIO_SUCCESS, err);
	TEST_ASSERT_EQUAL(3, epoll_ctl_fake.call_count);
	TEST_ASSERT_EQUAL(loop.epoll_fd, epoll_ctl_fake.arg0_val);
	TEST_ASSERT_EQUAL(EPOLL_CTL_ADD, epoll_ctl_fake.arg1_val);
	TEST_ASSERT_EQUAL(fake_fd, epoll_ctl_fake.arg2_val);

	err = cio_linux_eventloop_register_write(&loop, &ev);
	TEST_ASSERT_EQUAL(CIO_SUCCESS, err);
	TEST_ASSERT_EQUAL(4, epoll_ctl_fake.call_count);
	TEST_ASSERT_EQUAL(loop.epoll_fd, epoll_ctl_fake.arg0_val);
	TEST_ASSERT_EQUAL(EPOLL_CTL_MOD, epoll_ctl_fake.arg1_val);
	TEST_ASSERT_EQUAL(fake_fd, epoll_ctl_fake.arg2_val);

	cio_eventloop_run(&loop);
	TEST_ASSERT_EQUAL(1, epoll_callback_fake.call_count);
	TEST_ASSERT_EQUAL(&loop, epoll_callback_fake.arg0_val);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_EPOLL_ERROR, epoll_callback_fake.arg1_val, "callback was not called with error code!");

	cio_eventloop_destroy(&loop);
	TEST_ASSERT_EQUAL(2, close_fake.call_count);
}